

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# visitor.h
# Opt level: O3

VisitStatus
Fixpp::impl::
visitDictionary<Fixpp::v42::Spec::Dictionary,Fixpp::TypedParsingContext<void>,Fixpp::impl::MessageVisitor<Visitor,VisitRules>,VisitRules>
          (TypedParsingContext<void> *context,MessageVisitor<Visitor,_VisitRules> *visitor)

{
  char cVar1;
  bool bVar2;
  VisitStatus VVar3;
  long lVar4;
  char *pcVar5;
  ulong uVar6;
  
  VVar3 = VersionMismatch;
  if ((context->super_ParsingContext).version.second == 7) {
    pcVar5 = (context->super_ParsingContext).version.first;
    lVar4 = 0;
    uVar6 = 0;
    do {
      cVar1 = *pcVar5;
      pcVar5 = pcVar5 + 1;
      uVar6 = uVar6 | (long)cVar1 << ((byte)lVar4 & 0x3f);
      lVar4 = lVar4 + 8;
    } while (lVar4 != 0x38);
    if (uVar6 == 0x322e342e584946) {
      bVar2 = meta::typelist::ops::Visitor<$b0b178bd$>::
              visit<Fixpp::TypedParsingContext<void>_&,_Fixpp::impl::MessageVisitor<Visitor,_VisitRules>_&>
                        (context,visitor);
      VVar3 = (uint)!bVar2 * 2;
    }
  }
  return VVar3;
}

Assistant:

VisitStatus visitDictionary(Context& context, Visitor& visitor, Rules)
        {
            using Version = typename Dictionary::Version;
            using Header = typename Dictionary::Header::Ref;
            using Messages = typename Dictionary::Messages;

            using Overrides = typename Rules::Overrides;

            auto version = context.version.first;
            auto versionSize = context.version.second;

            using MessageVisitor = DictionaryVisitor<Header, Overrides>;

            if (Version::equals(version, versionSize))
            {
                using AllMessagesVisitor = meta::typelist::ops::Visitor<Messages, MessageVisitor>;
                if (AllMessagesVisitor::visit(context, visitor))
                    return VisitStatus::Ok;

                return VisitStatus::NotFound;
            }

            return VisitStatus::VersionMismatch;
        }